

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

bool __thiscall tinyusdz::primvar::PrimVar::is_valid(PrimVar *this)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  
  if ((this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_ts)._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if (this->_blocked != false) {
      return true;
    }
    pvVar1 = (this->_value).v_.vtable;
    if ((pvVar1 != (vtable_type *)0x0) && (uVar2 = (*pvVar1->type_id)(), uVar2 == 0)) {
      return false;
    }
    pvVar1 = (this->_value).v_.vtable;
    if (pvVar1 == (vtable_type *)0x0) {
      return true;
    }
    uVar2 = (*pvVar1->type_id)();
  }
  else {
    uVar2 = tinyusdz::value::TimeSamples::type_id(&this->_ts);
    if (uVar2 == 0) {
      return false;
    }
    uVar2 = tinyusdz::value::TimeSamples::type_id(&this->_ts);
  }
  return uVar2 != 1;
}

Assistant:

bool is_valid() const {
    if (has_timesamples()) {
      if ((_ts.type_id() == value::TypeId::TYPE_ID_INVALID) || (_ts.type_id() == value::TypeId::TYPE_ID_NULL)) {
        return false;
      }

      // TODO: Check if the type of timesamples is the same with the type of 'default' value
      return true;
    }

    // TODO: Make blocked valid?

    return has_value();
  }